

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O0

void __thiscall S2Builder::Graph::VertexOutMap::Init(VertexOutMap *this,Graph *g)

{
  bool bVar1;
  value_type_conflict1 vVar2;
  VertexId VVar3;
  EdgeId EVar4;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar5;
  Edge *pEVar6;
  int local_20;
  value_type_conflict1 local_1c;
  VertexId v;
  EdgeId e;
  Graph *g_local;
  VertexOutMap *this_local;
  
  _v = g;
  g_local = (Graph *)this;
  pvVar5 = Graph::edges(g);
  this->edges_ = pvVar5;
  VVar3 = Graph::num_vertices(_v);
  std::vector<int,_std::allocator<int>_>::reserve(&this->edge_begins_,(long)(VVar3 + 1));
  local_1c = 0;
  for (local_20 = 0; VVar3 = Graph::num_vertices(_v), local_20 <= VVar3; local_20 = local_20 + 1) {
    while( true ) {
      vVar2 = local_1c;
      EVar4 = Graph::num_edges(_v);
      bVar1 = false;
      if (vVar2 < EVar4) {
        pEVar6 = Graph::edge(_v,local_1c);
        bVar1 = pEVar6->first < local_20;
      }
      if (!bVar1) break;
      local_1c = local_1c + 1;
    }
    std::vector<int,_std::allocator<int>_>::push_back(&this->edge_begins_,&local_1c);
  }
  return;
}

Assistant:

void Graph::VertexOutMap::Init(const Graph& g) {
  edges_ = &g.edges();
  edge_begins_.reserve(g.num_vertices() + 1);
  EdgeId e = 0;
  for (VertexId v = 0; v <= g.num_vertices(); ++v) {
    while (e < g.num_edges() && g.edge(e).first < v) ++e;
    edge_begins_.push_back(e);
  }
}